

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reverselock_tests.cpp
# Opt level: O3

void __thiscall reverselock_tests::reverselock_errors::test_method(reverselock_errors *this)

{
  iterator in_R8;
  iterator pvVar1;
  iterator in_R9;
  iterator pvVar2;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  Mutex mutex;
  Mutex mutex2;
  UniqueLock<AnnotatedMixin<std::mutex>_> lock;
  UniqueLock<AnnotatedMixin<std::mutex>_> lock2;
  reverse_lock revlock9;
  check_type cVar3;
  undefined1 *local_2a0;
  undefined1 *local_298;
  char *local_290;
  char *local_288;
  char *local_280;
  char *local_278;
  undefined1 *local_270;
  undefined1 *local_268;
  char *local_260;
  char *local_258;
  char *local_250;
  char *local_248;
  char *local_240;
  char *local_238;
  assertion_result local_230;
  char **local_218;
  assertion_result local_210;
  undefined1 *local_1f8;
  undefined1 *local_1f0;
  char *local_1e8;
  char *local_1e0;
  char *local_1d8;
  char *local_1d0;
  undefined1 *local_1c8;
  undefined1 *local_1c0;
  char *local_1b8;
  char *local_1b0;
  char *local_1a8;
  char *local_1a0;
  undefined1 *local_198;
  undefined1 *local_190;
  char *local_188;
  char *local_180;
  char *local_178;
  char *local_170;
  undefined1 *local_168;
  undefined1 *local_160;
  char *local_158;
  char *local_150;
  char *local_148;
  char *local_140;
  undefined1 *local_138;
  undefined1 *local_130;
  char *local_128;
  char *local_120;
  __native_type local_118;
  __native_type local_e8;
  unique_lock<std::mutex> local_b8;
  unique_lock<std::mutex> local_a8;
  undefined1 local_98 [16];
  undefined1 *local_88;
  _Alloc_hider local_80;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_a8._M_device = (mutex_type *)&local_e8;
  local_e8.__data.__list.__next = (__pthread_internal_list *)0x0;
  local_e8._16_8_ = 0;
  local_e8.__data.__list.__prev = (__pthread_internal_list *)0x0;
  local_e8.__align = 0;
  local_e8._8_8_ = 0;
  local_118.__data.__list.__next = (__pthread_internal_list *)0x0;
  local_118._16_8_ = 0;
  local_118.__data.__list.__prev = (__pthread_internal_list *)0x0;
  local_118.__align = 0;
  local_118._8_8_ = 0;
  local_a8._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_a8);
  local_b8._M_device = (mutex_type *)&local_118;
  local_b8._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_b8);
  std::unique_lock<std::mutex>::unlock(&local_b8);
  local_128 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/reverselock_tests.cpp"
  ;
  local_120 = "";
  local_138 = &boost::unit_test::basic_cstring<char_const>::null;
  local_130 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x42;
  file.m_begin = (iterator)&local_128;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_138,msg);
  local_230._0_8_ = CONCAT71(local_230._1_7_,local_b8._M_owns) ^ 1;
  local_230.m_message.px = (element_type *)0x0;
  local_230.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_210._0_8_ = "!lock.owns_lock()";
  local_210.m_message.px = (element_type *)0xec5a65;
  local_98[8] = false;
  local_98._0_8_ = &PTR__lazy_ostream_013ae1c8;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_148 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/reverselock_tests.cpp"
  ;
  local_140 = "";
  pvVar2 = (iterator)0x0;
  local_80._M_p = (pointer)&local_210;
  boost::test_tools::tt_detail::report_assertion
            (&local_230,(lazy_ostream *)local_98,1,0,WARN,_cVar3,(size_t)&local_148,0x42);
  boost::detail::shared_count::~shared_count(&local_230.m_message.pn);
  pvVar1 = (iterator)0x46;
  UniqueLock<AnnotatedMixin<std::mutex>_>::reverse_lock::reverse_lock
            ((reverse_lock *)local_98,(UniqueLock<AnnotatedMixin<std::mutex>_> *)&local_b8,"lock",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/reverselock_tests.cpp"
             ,0x46);
  UniqueLock<AnnotatedMixin<std::mutex>_>::reverse_lock::~reverse_lock((reverse_lock *)local_98);
  local_158 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/reverselock_tests.cpp"
  ;
  local_150 = "";
  local_168 = &boost::unit_test::basic_cstring<char_const>::null;
  local_160 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x4b;
  file_00.m_begin = (iterator)&local_158;
  msg_00.m_end = pvVar2;
  msg_00.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_168,
             msg_00);
  local_230._0_8_ = local_230._0_8_ & 0xffffffffffffff00;
  local_230.m_message.px = (element_type *)0x0;
  local_230.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_210._0_8_ = "failed";
  local_210.m_message.px = (element_type *)0x112bf39;
  local_98[8] = false;
  local_98._0_8_ = &PTR__lazy_ostream_013ae1c8;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_178 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/reverselock_tests.cpp"
  ;
  local_170 = "";
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x0;
  local_80._M_p = (pointer)&local_210;
  boost::test_tools::tt_detail::report_assertion
            (&local_230,(lazy_ostream *)local_98,1,0,WARN,_cVar3,(size_t)&local_178,0x4b);
  boost::detail::shared_count::~shared_count(&local_230.m_message.pn);
  local_188 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/reverselock_tests.cpp"
  ;
  local_180 = "";
  local_198 = &boost::unit_test::basic_cstring<char_const>::null;
  local_190 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x4c;
  file_01.m_begin = (iterator)&local_188;
  msg_01.m_end = pvVar2;
  msg_01.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_198,
             msg_01);
  local_230._0_8_ = CONCAT71(local_230._1_7_,local_b8._M_owns) ^ 1;
  local_230.m_message.px = (element_type *)0x0;
  local_230.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_210._0_8_ = "!lock.owns_lock()";
  local_210.m_message.px = (element_type *)0xec5a65;
  local_98[8] = false;
  local_98._0_8_ = &PTR__lazy_ostream_013ae1c8;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_1a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/reverselock_tests.cpp"
  ;
  local_1a0 = "";
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x0;
  local_80._M_p = (pointer)&local_210;
  boost::test_tools::tt_detail::report_assertion
            (&local_230,(lazy_ostream *)local_98,1,0,WARN,_cVar3,(size_t)&local_1a8,0x4c);
  boost::detail::shared_count::~shared_count(&local_230.m_message.pn);
  std::unique_lock<std::mutex>::lock(&local_b8);
  local_1b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/reverselock_tests.cpp"
  ;
  local_1b0 = "";
  local_1c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1c0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x53;
  file_02.m_begin = (iterator)&local_1b8;
  msg_02.m_end = pvVar2;
  msg_02.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_1c8,
             msg_02);
  local_230.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)local_b8._M_owns;
  local_230.m_message.px = (element_type *)0x0;
  local_230.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_210._0_8_ = "lock.owns_lock()";
  local_210.m_message.px = (element_type *)0xec5a65;
  local_98[8] = false;
  local_98._0_8_ = &PTR__lazy_ostream_013ae1c8;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_1d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/reverselock_tests.cpp"
  ;
  local_1d0 = "";
  pvVar2 = (iterator)0x0;
  local_80._M_p = (pointer)&local_210;
  boost::test_tools::tt_detail::report_assertion
            (&local_230,(lazy_ostream *)local_98,1,0,WARN,_cVar3,(size_t)&local_1d8,0x53);
  boost::detail::shared_count::~shared_count(&local_230.m_message.pn);
  pvVar1 = (iterator)0x55;
  UniqueLock<AnnotatedMixin<std::mutex>_>::reverse_lock::reverse_lock
            ((reverse_lock *)local_98,(UniqueLock<AnnotatedMixin<std::mutex>_> *)&local_b8,"lock",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/reverselock_tests.cpp"
             ,0x55);
  local_1e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/reverselock_tests.cpp"
  ;
  local_1e0 = "";
  local_1f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1f0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x56;
  file_03.m_begin = (iterator)&local_1e8;
  msg_03.m_end = pvVar2;
  msg_03.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_1f8,
             msg_03);
  local_210._0_8_ = CONCAT71(local_210._1_7_,local_b8._M_owns) ^ 1;
  local_210.m_message.px = (element_type *)0x0;
  local_210.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_218 = &local_240;
  local_240 = "!lock.owns_lock()";
  local_238 = "";
  local_230.m_message.px = (element_type *)((ulong)local_230.m_message.px & 0xffffffffffffff00);
  local_230._0_8_ = &PTR__lazy_ostream_013ae1c8;
  local_230.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_250 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/reverselock_tests.cpp"
  ;
  local_248 = "";
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_210,(lazy_ostream *)&local_230,1,0,WARN,_cVar3,(size_t)&local_250,0x56);
  boost::detail::shared_count::~shared_count(&local_210.m_message.pn);
  UniqueLock<AnnotatedMixin<std::mutex>_>::reverse_lock::~reverse_lock((reverse_lock *)local_98);
  local_260 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/reverselock_tests.cpp"
  ;
  local_258 = "";
  local_270 = &boost::unit_test::basic_cstring<char_const>::null;
  local_268 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x59;
  file_04.m_begin = (iterator)&local_260;
  msg_04.m_end = pvVar2;
  msg_04.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_270,
             msg_04);
  local_230._0_8_ = local_230._0_8_ & 0xffffffffffffff00;
  local_230.m_message.px = (element_type *)0x0;
  local_230.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_210._0_8_ = "failed";
  local_210.m_message.px = (element_type *)0x112bf39;
  local_98[8] = false;
  local_98._0_8_ = &PTR__lazy_ostream_013ae1c8;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_280 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/reverselock_tests.cpp"
  ;
  local_278 = "";
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x0;
  local_80._M_p = (pointer)&local_210;
  boost::test_tools::tt_detail::report_assertion
            (&local_230,(lazy_ostream *)local_98,1,0,WARN,_cVar3,(size_t)&local_280,0x59);
  boost::detail::shared_count::~shared_count(&local_230.m_message.pn);
  local_290 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/reverselock_tests.cpp"
  ;
  local_288 = "";
  local_2a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_298 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x5a;
  file_05.m_begin = (iterator)&local_290;
  msg_05.m_end = pvVar2;
  msg_05.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_2a0,
             msg_05);
  local_230.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)local_b8._M_owns;
  local_230.m_message.px = (element_type *)0x0;
  local_230.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_210._0_8_ = "lock.owns_lock()";
  local_210.m_message.px = (element_type *)0xec5a65;
  local_98[8] = false;
  local_98._0_8_ = &PTR__lazy_ostream_013ae1c8;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_80._M_p = (pointer)&local_210;
  boost::test_tools::tt_detail::report_assertion
            (&local_230,(lazy_ostream *)local_98,1,0,WARN,0xec59dd,(size_t)&stack0xfffffffffffffd50,
             0x5a);
  boost::detail::shared_count::~shared_count(&local_230.m_message.pn);
  std::unique_lock<std::mutex>::~unique_lock(&local_b8);
  std::unique_lock<std::mutex>::~unique_lock(&local_a8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(reverselock_errors)
{
    Mutex mutex2;
    Mutex mutex;
    WAIT_LOCK(mutex2, lock2);
    WAIT_LOCK(mutex, lock);

#ifdef DEBUG_LOCKORDER
    bool prev = g_debug_lockorder_abort;
    g_debug_lockorder_abort = false;

    // Make sure trying to reverse lock a previous lock fails
    BOOST_CHECK_EXCEPTION(REVERSE_LOCK(lock2), std::logic_error, HasReason("lock2 was not most recent critical section locked"));
    BOOST_CHECK(lock2.owns_lock());

    g_debug_lockorder_abort = prev;
#endif

    // Make sure trying to reverse lock an unlocked lock fails
    lock.unlock();

    BOOST_CHECK(!lock.owns_lock());

    bool failed = false;
    try {
        REVERSE_LOCK(lock);
    } catch(...) {
        failed = true;
    }

    BOOST_CHECK(failed);
    BOOST_CHECK(!lock.owns_lock());

    // Locking the original lock after it has been taken by a reverse lock
    // makes no sense. Ensure that the original lock no longer owns the lock
    // after giving it to a reverse one.

    lock.lock();
    BOOST_CHECK(lock.owns_lock());
    {
        REVERSE_LOCK(lock);
        BOOST_CHECK(!lock.owns_lock());
    }

    BOOST_CHECK(failed);
    BOOST_CHECK(lock.owns_lock());
}